

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O0

void __thiscall
TransactionContext_SequenceApiTestWithKey_Test::TestBody
          (TransactionContext_SequenceApiTestWithKey_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData tx;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  TransactionContext txc;
  Amount fee;
  Address address2;
  Address address;
  UtxoData utxo2;
  UtxoData utxo1;
  AddressFactory factory;
  undefined8 in_stack_ffffffffffffdd58;
  UtxoData *in_stack_ffffffffffffdd60;
  UtxoData *in_stack_ffffffffffffdd68;
  TransactionContext *in_stack_ffffffffffffdd70;
  undefined7 in_stack_ffffffffffffdd78;
  undefined1 in_stack_ffffffffffffdd7f;
  undefined7 in_stack_ffffffffffffdd88;
  undefined1 in_stack_ffffffffffffdd8f;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffdd90;
  OutPoint *in_stack_ffffffffffffdd98;
  undefined7 in_stack_ffffffffffffdda0;
  undefined1 in_stack_ffffffffffffdda7;
  UtxoData *in_stack_ffffffffffffddd0;
  allocator *paVar4;
  UtxoData *in_stack_ffffffffffffddd8;
  undefined6 in_stack_ffffffffffffdde0;
  undefined1 in_stack_ffffffffffffdde6;
  undefined1 in_stack_ffffffffffffdde7;
  undefined8 **local_21d8;
  AssertHelper local_2170;
  Message local_2168;
  string local_2160;
  AssertionResult local_2140;
  AssertHelper local_2130;
  Message local_2128;
  int64_t local_2120;
  int64_t local_2118;
  undefined1 local_2110;
  Amount local_2108;
  int64_t local_20f8;
  AssertionResult local_20f0;
  AssertHelper local_20e0;
  Message local_20d8;
  ByteData local_20d0;
  AssertHelper local_20b8;
  Message local_20b0;
  OutPoint local_20a8;
  AssertHelper local_2080;
  Message local_2078;
  SigHashType local_2070;
  allocator local_2061;
  string local_2060;
  Privkey local_2040;
  allocator local_2019;
  string local_2018;
  Pubkey local_1ff8;
  OutPoint local_1fe0;
  AssertHelper local_1fb8;
  Message local_1fb0 [2];
  ByteData local_1fa0;
  byte local_1f81;
  ConstCharPtr local_1f80;
  AssertHelper local_1f78;
  Message local_1f70;
  OutPoint local_1f68;
  AssertHelper local_1f40;
  Message local_1f38;
  SigHashType local_1f30;
  allocator local_1f21;
  string local_1f20;
  Privkey local_1f00;
  allocator local_1ed9;
  string local_1ed8;
  Pubkey local_1eb8;
  OutPoint local_1ea0;
  ByteData local_1e78;
  AssertHelper local_1e60;
  Message local_1e58 [2];
  undefined1 **local_1e48;
  undefined8 *local_1e40 [51];
  undefined1 in_stack_ffffffffffffe35f;
  SigHashType *in_stack_ffffffffffffe360;
  Privkey *in_stack_ffffffffffffe368;
  Pubkey *in_stack_ffffffffffffe370;
  OutPoint *in_stack_ffffffffffffe378;
  TransactionContext *in_stack_ffffffffffffe380;
  ByteData256 *in_stack_ffffffffffffe390;
  ByteData *in_stack_ffffffffffffe398;
  TransactionContext *in_stack_ffffffffffffe430;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffe438;
  TransactionContext *in_stack_ffffffffffffe440;
  undefined1 local_1918 [688];
  OutPoint *in_stack_ffffffffffffe998;
  TransactionContext *in_stack_ffffffffffffe9a0;
  undefined1 **local_13f0;
  undefined8 local_13e8;
  int64_t local_13c8;
  undefined1 local_13c0;
  int64_t local_13b8;
  undefined1 local_13b0;
  OutPoint local_13a8;
  AssertHelper local_1380;
  Message local_1378 [25];
  Amount local_12b0;
  allocator local_1299;
  string local_1298;
  Address local_1278;
  allocator local_10f1;
  string local_10f0;
  Address local_10d0;
  Amount local_f50;
  allocator local_f39;
  string local_f38 [32];
  Address local_f18;
  allocator local_d91;
  string local_d90;
  Script local_d70;
  allocator local_d31;
  string local_d30;
  Txid local_d10;
  undefined8 local_cf0;
  Txid local_cc8;
  uint32_t local_ca8;
  Script local_ca0 [2];
  Address local_c30;
  string local_ab0 [32];
  int64_t local_a90;
  undefined1 local_a88;
  undefined4 local_a80;
  undefined8 local_a78;
  Amount local_7c8;
  allocator local_7b1;
  string local_7b0 [32];
  Address local_790;
  allocator local_609;
  string local_608;
  Script local_5e8;
  allocator local_5a9;
  string local_5a8;
  Txid local_588;
  undefined8 local_558;
  Txid local_530;
  uint32_t local_510;
  Script local_508 [2];
  Address local_498;
  string local_318 [32];
  Amount local_2f8;
  undefined4 local_2e8;
  undefined8 local_2e0;
  
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)in_stack_ffffffffffffdd60,
             (NetType)((ulong)in_stack_ffffffffffffdd58 >> 0x20));
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffddd0);
  local_558 = 0;
  local_2e0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5a8,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_5a9);
  cfd::core::Txid::Txid(&local_588,&local_5a8);
  cfd::core::Txid::operator=(&local_530,&local_588);
  cfd::core::Txid::~Txid((Txid *)0x254046);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  local_510 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_608,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",&local_609);
  cfd::core::Script::Script(&local_5e8,&local_608);
  cfd::core::Script::operator=(local_508,&local_5e8);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffdd60);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW",&local_7b1);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)in_stack_ffffffffffffdd68,(string *)in_stack_ffffffffffffdd60);
  cfd::core::Address::operator=(&local_498,&local_790);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffdd60);
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  std::__cxx11::string::operator=
            (local_318,"pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_7c8,10000000);
  local_2f8.ignore_check_ = local_7c8.ignore_check_;
  local_2f8.amount_ = local_7c8.amount_;
  local_2e8 = 2;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffddd0);
  local_cf0 = 0;
  local_a78 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d30,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,&local_d31);
  cfd::core::Txid::Txid(&local_d10,&local_d30);
  cfd::core::Txid::operator=(&local_cc8,&local_d10);
  cfd::core::Txid::~Txid((Txid *)0x25426b);
  std::__cxx11::string::~string((string *)&local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  local_ca8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d90,"a9145d54db96a28f844a744e393fcd699d6f825b284187",&local_d91);
  cfd::core::Script::Script(&local_d70,&local_d90);
  cfd::core::Script::operator=(local_ca0,&local_d70);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffdd60);
  std::__cxx11::string::~string((string *)&local_d90);
  std::allocator<char>::~allocator((allocator<char> *)&local_d91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f38,"2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16",&local_f39);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)in_stack_ffffffffffffdd68,(string *)in_stack_ffffffffffffdd60);
  cfd::core::Address::operator=(&local_c30,&local_f18);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffdd60);
  std::__cxx11::string::~string(local_f38);
  std::allocator<char>::~allocator((allocator<char> *)&local_f39);
  std::__cxx11::string::operator=
            (local_ab0,
             "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))");
  cfd::core::Amount::Amount(&local_f50,180000);
  local_a88 = local_f50.ignore_check_;
  local_a90 = local_f50.amount_;
  local_a80 = 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_10f0,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo",&local_10f1);
  cfd::core::Address::Address(&local_10d0,&local_10f0);
  std::__cxx11::string::~string((string *)&local_10f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1298,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu",&local_1299);
  cfd::core::Address::Address(&local_1278,&local_1298);
  std::__cxx11::string::~string((string *)&local_1298);
  std::allocator<char>::~allocator((allocator<char> *)&local_1299);
  cfd::core::Amount::Amount(&local_12b0,10000);
  cfd::TransactionContext::TransactionContext
            ((TransactionContext *)in_stack_ffffffffffffdd60,
             (uint32_t)((ulong)in_stack_ffffffffffffdd58 >> 0x20),
             (uint32_t)in_stack_ffffffffffffdd58);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::AddInput(in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68);
    }
  }
  else {
    testing::Message::Message(local_1378);
    testing::internal::AssertHelper::AssertHelper
              (&local_1380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1b4,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_1380,local_1378);
    testing::internal::AssertHelper::~AssertHelper(&local_1380);
    testing::Message::~Message((Message *)0x254981);
  }
  cfd::core::OutPoint::OutPoint(&local_13a8,&local_cc8,local_ca8);
  cfd::TransactionContext::AddTxIn
            ((TransactionContext *)CONCAT17(in_stack_ffffffffffffdda7,in_stack_ffffffffffffdda0),
             in_stack_ffffffffffffdd98);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x254a0e);
  AVar3 = cfd::core::operator-(&local_2f8,&local_12b0);
  local_13c8 = AVar3.amount_;
  local_13c0 = AVar3.ignore_check_;
  local_13b8 = local_13c8;
  local_13b0 = local_13c0;
  cfd::TransactionContext::AddTxOut
            ((TransactionContext *)
             CONCAT17(in_stack_ffffffffffffdde7,
                      CONCAT16(in_stack_ffffffffffffdde6,in_stack_ffffffffffffdde0)),
             (Address *)in_stack_ffffffffffffddd8,(Amount *)in_stack_ffffffffffffddd0);
  cfd::TransactionContext::AddTxOut
            ((TransactionContext *)
             CONCAT17(in_stack_ffffffffffffdde7,
                      CONCAT16(in_stack_ffffffffffffdde6,in_stack_ffffffffffffdde0)),
             (Address *)in_stack_ffffffffffffddd8,(Amount *)in_stack_ffffffffffffddd0);
  local_1e48 = (undefined1 **)local_1e40;
  cfd::UtxoData::UtxoData
            ((UtxoData *)
             CONCAT17(in_stack_ffffffffffffdde7,
                      CONCAT16(in_stack_ffffffffffffdde6,in_stack_ffffffffffffdde0)),
             in_stack_ffffffffffffddd8);
  local_1e48 = (undefined1 **)local_1918;
  cfd::UtxoData::UtxoData
            ((UtxoData *)
             CONCAT17(in_stack_ffffffffffffdde7,
                      CONCAT16(in_stack_ffffffffffffdde6,in_stack_ffffffffffffdde0)),
             in_stack_ffffffffffffddd8);
  local_13f0 = (undefined1 **)local_1e40;
  local_13e8 = 2;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x254b1d);
  __l._M_len._0_7_ = in_stack_ffffffffffffdda0;
  __l._M_array = (iterator)in_stack_ffffffffffffdd98;
  __l._M_len._7_1_ = in_stack_ffffffffffffdda7;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (in_stack_ffffffffffffdd90,__l,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffdd8f,in_stack_ffffffffffffdd88));
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x254b51);
  local_21d8 = &local_13f0;
  do {
    local_21d8 = local_21d8 + -0xa5;
    cfd::UtxoData::~UtxoData(in_stack_ffffffffffffdd60);
  } while (local_21d8 != local_1e40);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::CollectInputUtxo(in_stack_ffffffffffffe440,in_stack_ffffffffffffe438)
      ;
    }
  }
  else {
    testing::Message::Message(local_1e58);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1ba,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1e60,local_1e58);
    testing::internal::AssertHelper::~AssertHelper(&local_1e60);
    testing::Message::~Message((Message *)0x254dd0);
  }
  cfd::core::ByteData::ByteData(&local_1e78);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_1ea0,&local_530,local_510);
      paVar4 = &local_1ed9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1ed8,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",paVar4);
      cfd::core::Pubkey::Pubkey(&local_1eb8,&local_1ed8);
      paVar4 = &local_1f21;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1f20,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",paVar4
                );
      cfd::core::Privkey::FromWif(&local_1f00,&local_1f20,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_1f30);
      in_stack_ffffffffffffdd60 = (UtxoData *)0x0;
      cfd::TransactionContext::SignWithKey
                (in_stack_ffffffffffffe380,in_stack_ffffffffffffe378,in_stack_ffffffffffffe370,
                 in_stack_ffffffffffffe368,in_stack_ffffffffffffe360,(bool)in_stack_ffffffffffffe35f
                 ,in_stack_ffffffffffffe390,in_stack_ffffffffffffe398);
      cfd::core::Privkey::~Privkey((Privkey *)0x254f7c);
      std::__cxx11::string::~string((string *)&local_1f20);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f21);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x254fa3);
      std::__cxx11::string::~string((string *)&local_1ed8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ed9);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x254fca);
    }
  }
  else {
    testing::Message::Message(&local_1f38);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c1,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1f40,&local_1f38);
    testing::internal::AssertHelper::~AssertHelper(&local_1f40);
    testing::Message::~Message((Message *)0x25515c);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_1f68,&local_530,local_510);
      cfd::TransactionContext::Verify(in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x255219);
    }
  }
  else {
    testing::Message::Message(&local_1f70);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c2,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1f78,&local_1f70);
    testing::internal::AssertHelper::~AssertHelper(&local_1f78);
    testing::Message::~Message((Message *)0x2552e3);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_1f80,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_1f80);
  if (bVar1) {
    local_1f81 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize((TransactionContext *)in_stack_ffffffffffffdd68);
      cfd::core::ByteData::operator=(&local_1e78,&local_1fa0);
      cfd::core::ByteData::~ByteData((ByteData *)0x2553bf);
    }
    if ((local_1f81 & 1) != 0) goto LAB_00255538;
    local_1f80.value =
         "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_1fb0);
  testing::internal::AssertHelper::AssertHelper
            (&local_1fb8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
             ,0x1c4,local_1f80.value);
  testing::internal::AssertHelper::operator=(&local_1fb8,local_1fb0);
  testing::internal::AssertHelper::~AssertHelper(&local_1fb8);
  testing::Message::~Message((Message *)0x2554ed);
LAB_00255538:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_1fe0,&local_cc8,local_ca8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2018,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",&local_2019);
      cfd::core::Pubkey::Pubkey(&local_1ff8,&local_2018);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2060,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
                 &local_2061);
      cfd::core::Privkey::FromWif(&local_2040,&local_2060,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2070);
      in_stack_ffffffffffffdd60 = (UtxoData *)0x0;
      cfd::TransactionContext::SignWithKey
                (in_stack_ffffffffffffe380,in_stack_ffffffffffffe378,in_stack_ffffffffffffe370,
                 in_stack_ffffffffffffe368,in_stack_ffffffffffffe360,(bool)in_stack_ffffffffffffe35f
                 ,in_stack_ffffffffffffe390,in_stack_ffffffffffffe398);
      cfd::core::Privkey::~Privkey((Privkey *)0x255678);
      std::__cxx11::string::~string((string *)&local_2060);
      std::allocator<char>::~allocator((allocator<char> *)&local_2061);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x25569f);
      std::__cxx11::string::~string((string *)&local_2018);
      std::allocator<char>::~allocator((allocator<char> *)&local_2019);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2556c6);
    }
  }
  else {
    testing::Message::Message(&local_2078);
    testing::internal::AssertHelper::AssertHelper
              (&local_2080,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c9,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2080,&local_2078);
    testing::internal::AssertHelper::~AssertHelper(&local_2080);
    testing::Message::~Message((Message *)0x25583f);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_20a8,&local_cc8,local_ca8);
      cfd::TransactionContext::Verify(in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2558fc);
    }
  }
  else {
    testing::Message::Message(&local_20b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_20b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1ca,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_20b8,&local_20b0);
    testing::internal::AssertHelper::~AssertHelper(&local_20b8);
    testing::Message::~Message((Message *)0x2559c6);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize((TransactionContext *)in_stack_ffffffffffffdd68);
      cfd::core::ByteData::operator=(&local_1e78,&local_20d0);
      cfd::core::ByteData::~ByteData((ByteData *)0x255a7c);
    }
  }
  else {
    testing::Message::Message(&local_20d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_20e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cb,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_20e0,&local_20d8);
    testing::internal::AssertHelper::~AssertHelper(&local_20e0);
    testing::Message::~Message((Message *)0x255b46);
  }
  AVar3 = cfd::TransactionContext::GetFeeAmount(in_stack_ffffffffffffe430);
  local_2118 = AVar3.amount_;
  local_2110 = AVar3.ignore_check_;
  local_2108.amount_ = local_2118;
  local_2108.ignore_check_ = (bool)local_2110;
  local_20f8 = cfd::core::Amount::GetSatoshiValue(&local_2108);
  local_2120 = cfd::core::Amount::GetSatoshiValue(&local_12b0);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((char *)CONCAT17(in_stack_ffffffffffffdd7f,in_stack_ffffffffffffdd78),
             (char *)in_stack_ffffffffffffdd70,(long *)in_stack_ffffffffffffdd68,
             (long *)in_stack_ffffffffffffdd60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20f0);
  if (!bVar1) {
    testing::Message::Message(&local_2128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x255ca5);
    testing::internal::AssertHelper::AssertHelper
              (&local_2130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2130,&local_2128);
    testing::internal::AssertHelper::~AssertHelper(&local_2130);
    testing::Message::~Message((Message *)0x255d02);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x255d5a);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_2160,&local_1e78);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2140,"tx.GetHex().c_str()",
             "\"02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000\""
             ,pcVar2,
             "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000"
            );
  std::__cxx11::string::~string((string *)&local_2160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2140);
  if (!bVar1) {
    testing::Message::Message(&local_2168);
    in_stack_ffffffffffffdd70 =
         (TransactionContext *)
         testing::AssertionResult::failure_message((AssertionResult *)0x255e41);
    testing::internal::AssertHelper::AssertHelper
              (&local_2170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cd,(char *)in_stack_ffffffffffffdd70);
    testing::internal::AssertHelper::operator=(&local_2170,&local_2168);
    testing::internal::AssertHelper::~AssertHelper(&local_2170);
    testing::Message::~Message((Message *)0x255e9e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x255ef3);
  cfd::core::ByteData::~ByteData((ByteData *)0x255f00);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffdd70);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_ffffffffffffdd60);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffdd60);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffdd60);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffdd60);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffdd60);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x255f5b);
  return;
}

Assistant:

TEST(TransactionContext, SequenceApiTestWithKey)
{
  AddressFactory factory(NetType::kRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2pkhAddress;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");

  Amount fee(int64_t{10000});
  TransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxOut(address, utxo1.amount - fee);
  txc.AddTxOut(address2, utxo2.amount);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000");
}